

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonius.hpp
# Opt level: O0

token_vector * cpptempl::tokenize(string *text,token_vector *tokens)

{
  byte bVar1;
  bool bVar2;
  ulong uVar3;
  char *pcVar4;
  TokenFor *in_RSI;
  string *in_RDI;
  string expression;
  string pre_text;
  size_t pos;
  TokenFor *in_stack_fffffffffffffc38;
  TokenFor *in_stack_fffffffffffffc40;
  string *in_stack_fffffffffffffc48;
  TokenFor *in_stack_fffffffffffffc50;
  string *in_stack_fffffffffffffc58;
  string *in_stack_fffffffffffffcc8;
  TokenFor *in_stack_fffffffffffffcd0;
  undefined1 local_2f1 [56];
  undefined1 local_2b9 [56];
  undefined1 local_281;
  string local_280 [55];
  allocator local_249;
  string local_248 [39];
  undefined1 local_221;
  string local_220 [55];
  allocator local_1e9;
  string local_1e8 [32];
  string local_1c8 [32];
  string local_1a8 [32];
  string local_188 [32];
  string local_168 [39];
  undefined1 local_141;
  string local_140 [48];
  int local_110;
  undefined1 local_10a;
  undefined1 local_109 [49];
  string local_d8 [39];
  undefined1 local_b1;
  string local_b0 [48];
  string local_80 [35];
  undefined1 local_5d;
  string local_50 [48];
  long local_20;
  TokenFor *local_18;
  TokenFor *local_8;
  
  local_18 = in_RSI;
  while( true ) {
    bVar1 = std::__cxx11::string::empty();
    if (((bVar1 ^ 0xff) & 1) == 0) {
      return (token_vector *)local_18;
    }
    local_20 = std::__cxx11::string::find((char *)in_RDI,0x2f8394);
    if (local_20 == -1) break;
    std::__cxx11::string::substr((ulong)local_80,(ulong)in_RDI);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      operator_new(0x28);
      local_b1 = 1;
      std::__cxx11::string::string(local_b0,local_80);
      TokenText::TokenText((TokenText *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_b1 = 0;
      std::shared_ptr<cpptempl::Token>::shared_ptr<cpptempl::TokenText,void>
                ((shared_ptr<cpptempl::Token> *)in_stack_fffffffffffffc40,
                 (TokenText *)in_stack_fffffffffffffc38);
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
      std::shared_ptr<cpptempl::Token>::~shared_ptr((shared_ptr<cpptempl::Token> *)0x20354a);
      std::__cxx11::string::~string(local_b0);
    }
    std::__cxx11::string::substr((ulong)local_d8,(ulong)in_RDI);
    std::__cxx11::string::operator=(in_RDI,local_d8);
    std::__cxx11::string::~string(local_d8);
    uVar3 = std::__cxx11::string::empty();
    if ((uVar3 & 1) == 0) {
      pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
      if (*pcVar4 == '$') {
        local_20 = std::__cxx11::string::find((char *)in_RDI,0x27f615);
        if (local_20 != -1) {
          operator_new(0x28);
          local_141 = 1;
          std::__cxx11::string::substr((ulong)local_140,(ulong)in_RDI);
          TokenVar::TokenVar((TokenVar *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          local_141 = 0;
          std::shared_ptr<cpptempl::Token>::shared_ptr<cpptempl::TokenVar,void>
                    ((shared_ptr<cpptempl::Token> *)in_stack_fffffffffffffc40,
                     (TokenVar *)in_stack_fffffffffffffc38);
          std::
          vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
          ::push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                       *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
          std::shared_ptr<cpptempl::Token>::~shared_ptr((shared_ptr<cpptempl::Token> *)0x2038d5);
          std::__cxx11::string::~string(local_140);
          std::__cxx11::string::substr((ulong)local_168,(ulong)in_RDI);
          std::__cxx11::string::operator=(in_RDI,local_168);
          std::__cxx11::string::~string(local_168);
        }
      }
      else {
        pcVar4 = (char *)std::__cxx11::string::operator[]((ulong)in_RDI);
        if (*pcVar4 == '%') {
          local_20 = std::__cxx11::string::find((char *)in_RDI,0x27f615);
          if (local_20 != -1) {
            std::__cxx11::string::substr((ulong)local_1a8,(ulong)in_RDI);
            nonius::trim_copy(in_stack_fffffffffffffc58);
            std::__cxx11::string::~string(local_1a8);
            std::__cxx11::string::substr((ulong)local_1c8,(ulong)in_RDI);
            std::__cxx11::string::operator=(in_RDI,local_1c8);
            std::__cxx11::string::~string(local_1c8);
            std::allocator<char>::allocator();
            std::__cxx11::string::string(local_1e8,"for",&local_1e9);
            bVar2 = nonius::starts_with(in_stack_fffffffffffffc58,
                                        (string *)in_stack_fffffffffffffc50);
            std::__cxx11::string::~string(local_1e8);
            std::allocator<char>::~allocator((allocator<char> *)&local_1e9);
            if (bVar2) {
              operator_new(0x60);
              local_221 = 1;
              std::__cxx11::string::string(local_220,local_188);
              TokenFor::TokenFor(in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8);
              local_221 = 0;
              std::shared_ptr<cpptempl::Token>::shared_ptr<cpptempl::TokenFor,void>
                        ((shared_ptr<cpptempl::Token> *)in_stack_fffffffffffffc40,
                         in_stack_fffffffffffffc38);
              std::
              vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
              ::push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                           *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
              std::shared_ptr<cpptempl::Token>::~shared_ptr((shared_ptr<cpptempl::Token> *)0x203b9f)
              ;
              std::__cxx11::string::~string(local_220);
            }
            else {
              std::allocator<char>::allocator();
              std::__cxx11::string::string(local_248,"if",&local_249);
              bVar2 = nonius::starts_with(in_stack_fffffffffffffc58,
                                          (string *)in_stack_fffffffffffffc50);
              std::__cxx11::string::~string(local_248);
              std::allocator<char>::~allocator((allocator<char> *)&local_249);
              if (bVar2) {
                operator_new(0x40);
                local_281 = 1;
                std::__cxx11::string::string(local_280,local_188);
                TokenIf::TokenIf((TokenIf *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
                local_281 = 0;
                std::shared_ptr<cpptempl::Token>::shared_ptr<cpptempl::TokenIf,void>
                          ((shared_ptr<cpptempl::Token> *)in_stack_fffffffffffffc40,
                           (TokenIf *)in_stack_fffffffffffffc38);
                std::
                vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                ::push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                             *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
                std::shared_ptr<cpptempl::Token>::~shared_ptr
                          ((shared_ptr<cpptempl::Token> *)0x203db0);
                std::__cxx11::string::~string(local_280);
              }
              else {
                in_stack_fffffffffffffc50 = local_18;
                in_stack_fffffffffffffc58 = (string *)operator_new(0x28);
                local_2b9[0] = '\x01';
                nonius::trim_copy(in_stack_fffffffffffffc58);
                TokenEnd::TokenEnd((TokenEnd *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
                local_2b9[0] = '\0';
                std::shared_ptr<cpptempl::Token>::shared_ptr<cpptempl::TokenEnd,void>
                          ((shared_ptr<cpptempl::Token> *)in_stack_fffffffffffffc40,
                           (TokenEnd *)in_stack_fffffffffffffc38);
                std::
                vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                ::push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                             *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
                std::shared_ptr<cpptempl::Token>::~shared_ptr
                          ((shared_ptr<cpptempl::Token> *)0x203f13);
                std::__cxx11::string::~string((string *)(local_2b9 + 1));
              }
            }
            std::__cxx11::string::~string(local_188);
          }
        }
        else {
          in_stack_fffffffffffffc40 = local_18;
          in_stack_fffffffffffffc48 = (string *)operator_new(0x28);
          in_stack_fffffffffffffc38 = (TokenFor *)local_2f1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)(local_2f1 + 1),"{",(allocator *)in_stack_fffffffffffffc38);
          TokenText::TokenText((TokenText *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
          std::shared_ptr<cpptempl::Token>::shared_ptr<cpptempl::TokenText,void>
                    ((shared_ptr<cpptempl::Token> *)in_stack_fffffffffffffc40,
                     (TokenText *)in_stack_fffffffffffffc38);
          std::
          vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
          ::push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                       *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
          std::shared_ptr<cpptempl::Token>::~shared_ptr((shared_ptr<cpptempl::Token> *)0x204063);
          std::__cxx11::string::~string((string *)(local_2f1 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_2f1);
        }
      }
      local_110 = 0;
    }
    else {
      in_stack_fffffffffffffcd0 = local_18;
      operator_new(0x28);
      local_10a = 1;
      in_stack_fffffffffffffcc8 = (string *)local_109;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)(local_109 + 1),"{",(allocator *)in_stack_fffffffffffffcc8);
      TokenText::TokenText((TokenText *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
      local_10a = 0;
      std::shared_ptr<cpptempl::Token>::shared_ptr<cpptempl::TokenText,void>
                ((shared_ptr<cpptempl::Token> *)in_stack_fffffffffffffc40,
                 (TokenText *)in_stack_fffffffffffffc38);
      std::
      vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
      push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
                 *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
      std::shared_ptr<cpptempl::Token>::~shared_ptr((shared_ptr<cpptempl::Token> *)0x20370c);
      std::__cxx11::string::~string((string *)(local_109 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_109);
      local_8 = local_18;
      local_110 = 1;
    }
    std::__cxx11::string::~string(local_80);
    if (local_110 != 0) {
      return (token_vector *)local_8;
    }
  }
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    operator_new(0x28);
    local_5d = 1;
    std::__cxx11::string::string(local_50,in_RDI);
    TokenText::TokenText((TokenText *)in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
    local_5d = 0;
    std::shared_ptr<cpptempl::Token>::shared_ptr<cpptempl::TokenText,void>
              ((shared_ptr<cpptempl::Token> *)in_stack_fffffffffffffc40,
               (TokenText *)in_stack_fffffffffffffc38);
    std::
    vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>::
    push_back((vector<std::shared_ptr<cpptempl::Token>,_std::allocator<std::shared_ptr<cpptempl::Token>_>_>
               *)in_stack_fffffffffffffc40,(value_type *)in_stack_fffffffffffffc38);
    std::shared_ptr<cpptempl::Token>::~shared_ptr((shared_ptr<cpptempl::Token> *)0x2033d6);
    std::__cxx11::string::~string(local_50);
  }
  return (token_vector *)local_18;
}

Assistant:

inline token_vector & tokenize(std::string text, token_vector &tokens)
    {
        while(! text.empty())
        {
            size_t pos = text.find("{") ;
            if (pos == std::string::npos)
            {
                if (! text.empty())
                {
                    tokens.push_back(token_ptr(new TokenText(text))) ;
                }
                return tokens ;
            }
            std::string pre_text = text.substr(0, pos) ;
            if (! pre_text.empty())
            {
                tokens.push_back(token_ptr(new TokenText(pre_text))) ;
            }
            text = text.substr(pos+1) ;
            if (text.empty())
            {
                tokens.push_back(token_ptr(new TokenText("{"))) ;
                return tokens ;
            }

            // variable
            if (text[0] == '$')
            {
                pos = text.find("}") ;
                if (pos != std::string::npos)
                {
                    tokens.push_back(token_ptr (new TokenVar(text.substr(1, pos-1)))) ;
                    text = text.substr(pos+1) ;
                }
            }
            // control statement
            else if (text[0] == '%')
            {
                pos = text.find("}") ;
                if (pos != std::string::npos)
                {
                    std::string expression = nonius::trim_copy(text.substr(1, pos-2)) ;
                    text = text.substr(pos+1) ;
                    if (nonius::starts_with(expression, "for"))
                    {
                        tokens.push_back(token_ptr (new TokenFor(expression))) ;
                    }
                    else if (nonius::starts_with(expression, "if"))
                    {
                        tokens.push_back(token_ptr (new TokenIf(expression))) ;
                    }
                    else
                    {
                        tokens.push_back(token_ptr (new TokenEnd(nonius::trim_copy(expression)))) ;
                    }
                }
            }
            else
            {
                tokens.push_back(token_ptr(new TokenText("{"))) ;
            }
        }
        return tokens ;
    }